

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void deqp::gls::calcShaderColorCoord<int>
               (Vec2 *coord,Vec3 *color,Vector<int,_4> *attribValue,bool isCoordinate,
               int numComponents)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float *pfVar6;
  undefined8 local_54;
  int local_4c;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  int local_28;
  undefined1 local_21;
  int numComponents_local;
  bool isCoordinate_local;
  Vector<int,_4> *attribValue_local;
  Vec3 *color_local;
  Vec2 *coord_local;
  
  local_28 = numComponents;
  local_21 = isCoordinate;
  _numComponents_local = attribValue;
  attribValue_local = (Vector<int,_4> *)color;
  color_local = (Vec3 *)coord;
  if (isCoordinate) {
    switch(numComponents) {
    case 1:
      iVar2 = tcu::Vector<int,_4>::x(attribValue);
      iVar3 = tcu::Vector<int,_4>::x(_numComponents_local);
      tcu::Vector<float,_2>::Vector(&local_30,(float)iVar2,(float)iVar3);
      *(float (*) [2])color_local->m_data = local_30.m_data;
      break;
    case 2:
      iVar2 = tcu::Vector<int,_4>::x(attribValue);
      iVar3 = tcu::Vector<int,_4>::y(_numComponents_local);
      tcu::Vector<float,_2>::Vector(&local_38,(float)iVar2,(float)iVar3);
      *(float (*) [2])color_local->m_data = local_38.m_data;
      break;
    case 3:
      iVar2 = tcu::Vector<int,_4>::x(attribValue);
      iVar3 = tcu::Vector<int,_4>::z(_numComponents_local);
      iVar4 = tcu::Vector<int,_4>::y(_numComponents_local);
      tcu::Vector<float,_2>::Vector(&local_40,(float)iVar2 + (float)iVar3,(float)iVar4);
      *(float (*) [2])color_local->m_data = local_40.m_data;
      break;
    case 4:
      iVar2 = tcu::Vector<int,_4>::x(attribValue);
      iVar3 = tcu::Vector<int,_4>::z(_numComponents_local);
      iVar4 = tcu::Vector<int,_4>::y(_numComponents_local);
      iVar5 = tcu::Vector<int,_4>::w(_numComponents_local);
      tcu::Vector<float,_2>::Vector
                (&local_48,(float)iVar2 + (float)iVar3,(float)iVar4 + (float)iVar5);
      *(float (*) [2])color_local->m_data = local_48.m_data;
    }
  }
  else {
    switch(numComponents) {
    case 1:
      iVar2 = tcu::Vector<int,_4>::x(attribValue);
      tcu::operator*((tcu *)&local_54,color,(float)iVar2);
      *(undefined8 *)attribValue_local->m_data = local_54;
      attribValue_local->m_data[2] = local_4c;
      break;
    case 2:
      pfVar6 = tcu::Vector<float,_3>::x(color);
      fVar1 = *pfVar6;
      iVar2 = tcu::Vector<int,_4>::x(_numComponents_local);
      pfVar6 = tcu::Vector<float,_3>::x((Vector<float,_3> *)attribValue_local);
      *pfVar6 = fVar1 * (float)iVar2;
      pfVar6 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      fVar1 = *pfVar6;
      iVar2 = tcu::Vector<int,_4>::y(_numComponents_local);
      pfVar6 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      *pfVar6 = fVar1 * (float)iVar2;
      break;
    case 3:
      pfVar6 = tcu::Vector<float,_3>::x(color);
      fVar1 = *pfVar6;
      iVar2 = tcu::Vector<int,_4>::x(_numComponents_local);
      pfVar6 = tcu::Vector<float,_3>::x((Vector<float,_3> *)attribValue_local);
      *pfVar6 = fVar1 * (float)iVar2;
      pfVar6 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      fVar1 = *pfVar6;
      iVar2 = tcu::Vector<int,_4>::y(_numComponents_local);
      pfVar6 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      *pfVar6 = fVar1 * (float)iVar2;
      pfVar6 = tcu::Vector<float,_3>::z((Vector<float,_3> *)attribValue_local);
      fVar1 = *pfVar6;
      iVar2 = tcu::Vector<int,_4>::z(_numComponents_local);
      pfVar6 = tcu::Vector<float,_3>::z((Vector<float,_3> *)attribValue_local);
      *pfVar6 = fVar1 * (float)iVar2;
      break;
    case 4:
      pfVar6 = tcu::Vector<float,_3>::x(color);
      fVar1 = *pfVar6;
      iVar2 = tcu::Vector<int,_4>::x(_numComponents_local);
      iVar3 = tcu::Vector<int,_4>::w(_numComponents_local);
      pfVar6 = tcu::Vector<float,_3>::x((Vector<float,_3> *)attribValue_local);
      *pfVar6 = fVar1 * (float)iVar2 * (float)iVar3;
      pfVar6 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      fVar1 = *pfVar6;
      iVar2 = tcu::Vector<int,_4>::y(_numComponents_local);
      iVar3 = tcu::Vector<int,_4>::w(_numComponents_local);
      pfVar6 = tcu::Vector<float,_3>::y((Vector<float,_3> *)attribValue_local);
      *pfVar6 = fVar1 * (float)iVar2 * (float)iVar3;
      pfVar6 = tcu::Vector<float,_3>::z((Vector<float,_3> *)attribValue_local);
      fVar1 = *pfVar6;
      iVar2 = tcu::Vector<int,_4>::z(_numComponents_local);
      iVar3 = tcu::Vector<int,_4>::w(_numComponents_local);
      pfVar6 = tcu::Vector<float,_3>::z((Vector<float,_3> *)attribValue_local);
      *pfVar6 = fVar1 * (float)iVar2 * (float)iVar3;
    }
  }
  return;
}

Assistant:

void calcShaderColorCoord (tcu::Vec2& coord, tcu::Vec3& color, const tcu::Vector<T, 4>& attribValue, bool isCoordinate, int numComponents)
{
	if (isCoordinate)
		switch (numComponents)
		{
			case 1:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.x());							break;
			case 2:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.y());							break;
			case 3:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y());							break;
			case 4:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y() + (float)attribValue.w());	break;

			default:
				DE_ASSERT(false);
		}
	else
	{
		switch (numComponents)
		{
			case 1:
				color = color * (float)attribValue.x();
				break;

			case 2:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				break;

			case 3:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				color.z() = color.z() * (float)attribValue.z();
				break;

			case 4:
				color.x() = color.x() * (float)attribValue.x() * (float)attribValue.w();
				color.y() = color.y() * (float)attribValue.y() * (float)attribValue.w();
				color.z() = color.z() * (float)attribValue.z() * (float)attribValue.w();
				break;

			default:
				DE_ASSERT(false);
		}
	}
}